

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O3

string * __thiscall
soul::Type::getDescription
          (string *__return_storage_ptr__,Type *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
          *getStructName)

{
  Category CVar1;
  int __val;
  bool bVar2;
  long lVar3;
  char cVar4;
  uint uVar5;
  long *plVar6;
  Structure *pSVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong uVar10;
  long *plVar11;
  ulong *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char cVar14;
  _Alloc_hider _Var15;
  undefined8 uVar16;
  char *pcVar17;
  ulong uVar18;
  string local_c8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  long *local_68;
  uint local_60;
  long local_58 [2];
  Type local_48;
  
  if (this->isConstant == true) {
    removeConst((Type *)&local_a8,this);
    getDescription(&local_c8,(Type *)&local_a8,getStructName);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x258fe2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)local_a8.field_2._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  if (this->isRef == true) {
    removeReference((Type *)&local_a8,this);
    getDescription(&local_c8,(Type *)&local_a8,getStructName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)local_a8.field_2._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  CVar1 = this->category;
  if (CVar1 == vector) {
    uVar5 = (this->primitiveType).type - void_;
    if (uVar5 < 9) {
      pcVar17 = *(char **)(&DAT_002caad0 + (ulong)uVar5 * 8);
    }
    else {
      pcVar17 = "<unknown>";
    }
    uVar18 = (ulong)this->boundingSize;
    cVar14 = '\x01';
    if (9 < uVar18) {
      uVar10 = uVar18;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (uVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_001a7cbf;
        }
        if (uVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_001a7cbf;
        }
        if (uVar10 < 10000) goto LAB_001a7cbf;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_001a7cbf:
    local_88 = &local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88->_M_local_buf,(uint)local_80,uVar18);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x259fc0);
    plVar11 = plVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar11) {
      local_a8.field_2._M_allocated_capacity = *plVar11;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *plVar11;
      local_a8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_a8._M_string_length = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar12 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_c8.field_2._M_allocated_capacity = *puVar12;
      local_c8.field_2._8_8_ = plVar6[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *puVar12;
      local_c8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    strlen(pcVar17);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar17);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    _Var15._M_p = (pointer)local_88;
    if (local_88 == &local_78) {
      return __return_storage_ptr__;
    }
    goto LAB_001a7e3b;
  }
  __val = this->boundingSize;
  if (CVar1 == array && __val == 0) {
    getArrayElementType((Type *)&local_a8,this);
    getDescription(&local_c8,(Type *)&local_a8,getStructName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull
              ((Structure *)local_a8.field_2._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  if (CVar1 == array) {
    getArrayElementType(&local_48,this);
    getDescription(&local_c8,&local_48,getStructName);
    if (this->category != array) {
      throwInternalCompilerError("isArray()","getArraySize",0x128);
    }
    uVar18 = (ulong)this->boundingSize;
    cVar14 = '\x01';
    if (9 < uVar18) {
      uVar10 = uVar18;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (uVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_001a7f1f;
        }
        if (uVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_001a7f1f;
        }
        if (uVar10 < 10000) goto LAB_001a7f1f;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_001a7f1f:
    local_68 = local_58;
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,uVar18);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x27f67c);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar13) {
      local_78._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_78._8_8_ = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)paVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
    paVar13 = &local_a8.field_2;
    puVar12 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_a8.field_2._M_allocated_capacity = *puVar12;
      local_a8.field_2._8_8_ = plVar6[3];
      local_a8._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *puVar12;
      local_a8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_a8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar16 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_a8._M_string_length + local_c8._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar13) {
        uVar16 = local_a8.field_2._M_allocated_capacity;
      }
      if (local_a8._M_string_length + local_c8._M_string_length <= (ulong)uVar16) {
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8._M_dataplus._M_p);
        goto LAB_001a805c;
      }
    }
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
LAB_001a805c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar9) {
      uVar16 = puVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar16;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = puVar8[1];
    *puVar8 = psVar9;
    puVar8[1] = 0;
    *(undefined1 *)psVar9 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar13) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78._M_allocated_capacity + 1);
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
    return __return_storage_ptr__;
  }
  switch(CVar1) {
  case wrap:
    std::__cxx11::to_string(&local_a8,__val);
    std::operator+(&local_c8,"wrap<",&local_a8);
    std::operator+(__return_storage_ptr__,&local_c8,">");
    goto LAB_001a7ec0;
  case clamp:
    std::__cxx11::to_string(&local_a8,__val);
    std::operator+(&local_c8,"clamp<",&local_a8);
    std::operator+(__return_storage_ptr__,&local_c8,">");
LAB_001a7ec0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_78._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    _Var15._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_001a7e3b:
      operator_delete(_Var15._M_p,
                      (ulong)((long)&(((Structure *)local_78._M_allocated_capacity)->
                                     super_RefCountedObject).refCount + 1));
    }
    break;
  case structure:
    pSVar7 = getStructRef(this);
    if ((getStructName->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*getStructName->_M_invoker)(__return_storage_ptr__,(_Any_data *)getStructName,pSVar7);
    break;
  case stringLiteral:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"string","");
    break;
  default:
    uVar5 = (this->primitiveType).type - void_;
    if (uVar5 < 9) {
      pcVar17 = *(char **)(&DAT_002caad0 + (ulong)uVar5 * 8);
    }
    else {
      pcVar17 = "<unknown>";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar17,(allocator<char> *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getDescription (const std::function<std::string(const Structure&)>& getStructName) const
{
    if (isConst())          return "const " + removeConst().getDescription (getStructName);
    if (isReference())      return removeReference().getDescription (getStructName) + "&";
    if (isVector())         return primitiveType.getDescription() + ("<" + std::to_string (getVectorSize()) + ">");
    if (isUnsizedArray())   return getArrayElementType().getDescription (getStructName) + ("[]");
    if (isArray())          return getArrayElementType().getDescription (getStructName) + ("[" + std::to_string (getArraySize()) + "]");
    if (isWrapped())        return "wrap<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isClamped())        return "clamp<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isStruct())         return getStructName (getStructRef());
    if (isStringLiteral())  return "string";

    return primitiveType.getDescription();
}